

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputStream.cpp
# Opt level: O0

void __thiscall cali::OutputStream::set_filename(OutputStream *this,char *filename)

{
  element_type *peVar1;
  char *local_18;
  char *filename_local;
  OutputStream *this_local;
  
  local_18 = filename;
  filename_local = (char *)this;
  peVar1 = std::
           __shared_ptr_access<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  OutputStreamImpl::reset(peVar1);
  peVar1 = std::
           __shared_ptr_access<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::filesystem::__cxx11::path::operator=(&peVar1->filename,&local_18);
  peVar1 = std::
           __shared_ptr_access<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  peVar1->type = File;
  return;
}

Assistant:

void OutputStream::set_filename(const char* filename)
{
    mP->reset();

    mP->filename = filename;
    mP->type     = StreamType::File;
}